

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_setglobal(lua_State *L,char *var)

{
  StkId pTVar1;
  TValue *t;
  GCObject *pGVar2;
  
  t = luaH_getint(&((L->l_G->l_registry).value_.gc)->h,2);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar2 = (GCObject *)luaS_new(L,var);
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = (pGVar2->gch).tt | 0x40;
  luaV_settable(L,t,L->top + -1,L->top + -2);
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_setglobal (lua_State *L, const char *var) {
  Table *reg = hvalue(&G(L)->l_registry);
  const TValue *gt;  /* global table */
  lua_lock(L);
  api_checknelems(L, 1);
  gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
  setsvalue2s(L, L->top++, luaS_new(L, var));
  luaV_settable(L, gt, L->top - 1, L->top - 2);
  L->top -= 2;  /* pop value and key */
  lua_unlock(L);
}